

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O2

Result __thiscall wabt::anon_unknown_19::BinaryReader::ReadSections(BinaryReader *this)

{
  Result RVar1;
  int iVar2;
  Enum EVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  Offset local_140;
  Offset section_size;
  Index *local_130;
  Index *local_128;
  Index *local_120;
  Index *local_118;
  TypeVector *local_110;
  Index *local_108;
  uint local_fc [2];
  uint32_t section_code;
  Index *local_f0;
  Index *local_e8;
  size_t local_e0;
  Index *local_d8;
  uint32_t offset;
  uint32_t size;
  Index local_index;
  Offset subsection_size;
  uint32_t index;
  Index num_data_segments;
  string_view name;
  Index num_names;
  Index function_index;
  uint32_t name_type;
  Index num_locals;
  
  local_f0 = &this->num_memories_;
  local_e8 = &this->num_tables_;
  local_130 = &this->num_function_signatures_;
  local_120 = &this->num_exports_;
  local_118 = &this->num_globals_;
  local_d8 = &this->num_signatures_;
  local_128 = &this->num_imports_;
  section_size = (Offset)&this->param_types_;
  local_110 = &this->result_types_;
  local_108 = &this->num_exceptions_;
  if ((this->state_).size <= (this->state_).offset) {
    return (Result)Ok;
  }
  RVar1 = ReadU32Leb128(this,local_fc,"section code");
  if (RVar1.enum_ == Error) {
    return (Result)Error;
  }
  RVar1 = ReadOffset(this,&local_140,"section size");
  if (RVar1.enum_ == Error) {
    return (Result)Error;
  }
  local_e0 = this->read_end_;
  uVar4 = (this->state_).offset + local_140;
  this->read_end_ = uVar4;
  uVar6 = (ulong)local_fc[0];
  if (0xb < uVar6) {
    PrintError(this,"invalid section code: %u; max is %u",uVar6,0xb);
    goto LAB_00d7ba5e;
  }
  if ((this->state_).size < uVar4) {
    pcVar5 = "invalid section size: extends past end";
LAB_00d7ba41:
    PrintError(this,pcVar5);
  }
  else {
    if (((local_fc[0] == 0) || (this->last_known_section_ == Invalid)) ||
       ((int)this->last_known_section_ < (int)local_fc[0])) {
      if ((local_fc[0] == 0) || (this->did_read_names_section_ == false)) {
        iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[6])(this->delegate_,uVar6,local_140);
        if (iVar2 == 0) {
          offset = (uint32_t)
                   CONCAT71((int7)((ulong)this->options_ >> 8),this->options_->stop_on_first_error);
          EVar3 = (*(code *)(&DAT_0100f61c + *(int *)(&DAT_0100f61c + uVar6 * 4)))();
          return (Result)EVar3;
        }
        pcVar5 = "BeginSection callback failed";
        goto LAB_00d7ba41;
      }
      pcVar5 = "%s section can not occur after Name section";
    }
    else {
      pcVar5 = "section %s out of order";
    }
    PrintError(this,pcVar5,*(undefined8 *)(g_section_name + uVar6 * 8));
  }
LAB_00d7ba5e:
  this->read_end_ = local_e0;
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadSections() {
  Result result = Result::Ok;

  while (state_.offset < state_.size) {
    uint32_t section_code;
    Offset section_size;
    CHECK_RESULT(ReadU32Leb128(&section_code, "section code"));
    CHECK_RESULT(ReadOffset(&section_size, "section size"));
    ReadEndRestoreGuard guard(this);
    read_end_ = state_.offset + section_size;
    if (section_code >= kBinarySectionCount) {
      PrintError("invalid section code: %u; max is %u", section_code,
                 kBinarySectionCount - 1);
      return Result::Error;
    }

    BinarySection section = static_cast<BinarySection>(section_code);

    ERROR_UNLESS(read_end_ <= state_.size,
                 "invalid section size: extends past end");

    ERROR_UNLESS(last_known_section_ == BinarySection::Invalid ||
                     section == BinarySection::Custom ||
                     section > last_known_section_,
                 "section %s out of order", GetSectionName(section));

    ERROR_UNLESS(!did_read_names_section_ || section == BinarySection::Custom,
                 "%s section can not occur after Name section",
                 GetSectionName(section));

    CALLBACK(BeginSection, section, section_size);

    bool stop_on_first_error = options_.stop_on_first_error;
    Result section_result = Result::Error;
    switch (section) {
      case BinarySection::Custom:
        section_result = ReadCustomSection(section_size);
        if (options_.fail_on_custom_section_error) {
          result |= section_result;
        } else {
          stop_on_first_error = false;
        }
        break;
      case BinarySection::Type:
        section_result = ReadTypeSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Import:
        section_result = ReadImportSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Function:
        section_result = ReadFunctionSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Table:
        section_result = ReadTableSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Memory:
        section_result = ReadMemorySection(section_size);
        result |= section_result;
        break;
      case BinarySection::Global:
        section_result = ReadGlobalSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Export:
        section_result = ReadExportSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Start:
        section_result = ReadStartSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Elem:
        section_result = ReadElemSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Code:
        section_result = ReadCodeSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Data:
        section_result = ReadDataSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Invalid:
        WABT_UNREACHABLE;
    }

    if (Failed(section_result)) {
      if (stop_on_first_error) {
        return Result::Error;
      }

      // If we're continuing after failing to read this section, move the
      // offset to the expected section end. This way we may be able to read
      // further sections.
      state_.offset = read_end_;
    }

    ERROR_UNLESS(state_.offset == read_end_,
                 "unfinished section (expected end: 0x%" PRIzx ")", read_end_);

    if (section != BinarySection::Custom) {
      last_known_section_ = section;
    }
  }

  return result;
}